

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralActivity::IfcStructuralActivity
          (IfcStructuralActivity *this,void **vtt)

{
  void *pvVar1;
  
  IfcProduct::IfcProduct(&this->super_IfcProduct,vtt + 1);
  pvVar1 = vtt[0x17];
  *(void **)&(this->super_IfcProduct).field_0x100 = pvVar1;
  *(void **)(&(this->super_IfcProduct).field_0x100 + *(long *)((long)pvVar1 + -0x18)) = vtt[0x18];
  *(undefined8 *)&(this->super_IfcProduct).field_0x108 = 0;
  pvVar1 = *vtt;
  *(void **)&(this->super_IfcProduct).super_IfcObject = pvVar1;
  *(void **)(&(this->super_IfcProduct).super_IfcObject.field_0x0 + *(long *)((long)pvVar1 + -0x18))
       = vtt[0x19];
  *(void **)&(this->super_IfcProduct).super_IfcObject.field_0x88 = vtt[0x1a];
  (this->super_IfcProduct).super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x1b];
  *(void **)&(this->super_IfcProduct).super_IfcObject.field_0xd0 = vtt[0x1c];
  *(void **)&(this->super_IfcProduct).field_0x100 = vtt[0x1d];
  *(undefined8 *)&(this->super_IfcProduct).field_0x110 = 0;
  (this->GlobalOrLocal)._M_dataplus._M_p = (pointer)&(this->GlobalOrLocal).field_2;
  (this->GlobalOrLocal)._M_string_length = 0;
  (this->GlobalOrLocal).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

IfcStructuralActivity() : Object("IfcStructuralActivity") {}